

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_3;
  MemberSyntax *args_5;
  IfGenerateSyntax *pIVar1;
  DeepCloneVisitor visitor_1;
  Token local_60;
  Token local_50;
  DeepCloneVisitor visitor;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  args_3 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x70),&visitor,(BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  args_5 = (MemberSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x88),&visitor_1,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x90) == (SyntaxNode *)0x0) {
    _visitor_1 = (SyntaxNode *)0x0;
  }
  else {
    _visitor_1 = detail::
                 visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                           (*(SyntaxNode **)(__fn + 0x90),&visitor_1,(BumpAllocator *)__child_stack)
    ;
  }
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::IfGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::MemberSyntax&,slang::syntax::ElseClauseSyntax*>
                     ((BumpAllocator *)__child_stack,args,&local_50,&local_60,
                      (ExpressionSyntax *)args_3,(Token *)&visitor,args_5,
                      (ElseClauseSyntax **)&visitor_1);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const IfGenerateSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<IfGenerateSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.condition, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<MemberSyntax>(*node.block, alloc),
        node.elseClause ? deepClone(*node.elseClause, alloc) : nullptr
    );
}